

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void sysbvm_scanner_skipSingleLineComment(sysbvm_scannerState_t *state)

{
  uint8_t uVar1;
  uint8_t c;
  sysbvm_scannerState_t *state_local;
  
  state->position = state->position + 2;
  while( true ) {
    if (state->size <= state->position) {
      return;
    }
    uVar1 = state->text[state->position];
    state->position = state->position + 1;
    if (uVar1 == '\n') break;
    if (uVar1 == '\r') {
      return;
    }
  }
  return;
}

Assistant:

static void sysbvm_scanner_skipSingleLineComment(sysbvm_scannerState_t *state)
{
    state->position += 2;
    while(state->position < state->size)
    {
        uint8_t c = state->text[state->position];
        ++state->position;
        if(c == '\n' || c == '\r')
            break;
    }
}